

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScene::~QGraphicsScene(QGraphicsScene *this)

{
  bool bVar1;
  const_iterator o;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QGraphicsView *view;
  add_const_t<const_QList<QGraphicsView_*>_> *__range1;
  QGraphicsScenePrivate *d;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QGraphicsView_*> views;
  QList<QGraphicsView_*> *in_stack_ffffffffffffffa0;
  QGraphicsView *this_00;
  const_iterator local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  QWidgetData *local_8;
  
  local_8 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  *(undefined ***)in_RDI = &PTR_metaObject_00d34500;
  d_func((QGraphicsScene *)0x9c9ae7);
  if (((byte)QCoreApplicationPrivate::is_app_closing & 1) == 0) {
    QCoreApplication::instance();
    QApplication::d_func((QApplication *)0x9c9b05);
    QList<QGraphicsScene*>::removeAll<QGraphicsScene*>
              ((QList<QGraphicsScene_*> *)in_stack_ffffffffffffffa0,(QGraphicsScene **)in_RDI);
  }
  clear((QGraphicsScene *)in_stack_ffffffffffffffa0);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QGraphicsView_*>::QList(in_stack_ffffffffffffffa0,(QList<QGraphicsView_*> *)in_RDI);
  this_00 = (QGraphicsView *)&local_28;
  local_30.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = QList<QGraphicsView_*>::begin(in_stack_ffffffffffffffa0);
  o = QList<QGraphicsView_*>::end(in_stack_ffffffffffffffa0);
  while( true ) {
    bVar1 = QList<QGraphicsView_*>::const_iterator::operator!=(&local_30,o);
    if (!bVar1) break;
    QList<QGraphicsView_*>::const_iterator::operator*(&local_30);
    QGraphicsView::setScene(this_00,(QGraphicsScene *)view);
    QList<QGraphicsView_*>::const_iterator::operator++(&local_30);
  }
  QList<QGraphicsView_*>::~QList((QList<QGraphicsView_*> *)0x9c9c09);
  QObject::~QObject(in_RDI);
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QGraphicsScene::~QGraphicsScene()
{
    Q_D(QGraphicsScene);

    // Remove this scene from qApp's global scene list.
    if (!QApplicationPrivate::is_app_closing)
        qApp->d_func()->scene_list.removeAll(this);

    clear();

    // Remove this scene from all associated views.
    // Note: d->views is modified by QGraphicsView::setScene, so must make a copy
    const auto views = d->views;
    for (auto view : std::as_const(views))
        view->setScene(nullptr);
}